

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.hpp
# Opt level: O0

string * __thiscall OpenMD::SelectionCompiler::getErrorMessage_abi_cxx11_(SelectionCompiler *this)

{
  ulong uVar1;
  string *in_RSI;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  string *strError;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  string local_58 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffc0;
  char *in_stack_ffffffffffffffc8;
  
  __lhs = in_RDI;
  std::__cxx11::string::string((string *)in_RDI,in_RSI + 0x90);
  std::operator+(in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  std::operator+(__lhs,(char *)in_RDI);
  std::__cxx11::string::operator+=((string *)in_RDI,(string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
  std::__cxx11::string::~string(local_58);
  uVar1 = std::__cxx11::string::empty();
  if ((uVar1 & 1) == 0) {
    std::__cxx11::string::operator+=((string *)in_RDI,in_RSI);
  }
  return __lhs;
}

Assistant:

std::string getErrorMessage() {
      std::string strError = errorMessage;
      strError += " : " + errorLine + "\n";

      if (!filename.empty()) { strError += filename; }

      return strError;
    }